

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiver *receiver)

{
  bool bVar1;
  uint64_t len_00;
  int iVar2;
  function<bool_(const_char_*,_unsigned_long)> local_128;
  function<bool_(unsigned_long,_unsigned_long)> local_108;
  uint64_t local_e8;
  uint64_t len;
  function<bool_(const_char_*,_unsigned_long)> local_c0;
  byte local_9a;
  byte local_99;
  undefined4 local_98;
  bool exceed_payload_max_length;
  bool ret;
  string local_88;
  anon_class_8_1_b7b80f6d local_68;
  undefined1 local_60 [8];
  ContentReceiver out;
  ContentReceiver *receiver_local;
  Progress *progress_local;
  int *status_local;
  size_t payload_max_length_local;
  Response *x_local;
  Stream *strm_local;
  
  local_68.receiver = receiver;
  out._M_invoker = (_Invoker_type)receiver;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::detail::read_content<httplib::Response>(httplib::Stream&,httplib::Response&,unsigned_long,int&,std::function<bool(unsigned_long,unsigned_long)>,std::function<bool(char_const*,unsigned_long)>)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool(char_const*,unsigned_long)> *)local_60,&local_68);
  Response::get_header_value_abi_cxx11_(&local_88,x,"Content-Encoding",0);
  bVar1 = std::operator==(&local_88,"gzip");
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar1) {
    *status = 0x19f;
    strm_local._7_1_ = false;
  }
  else {
    local_99 = 1;
    local_9a = 0;
    bVar1 = is_chunked_transfer_encoding(&x->headers);
    if (bVar1) {
      std::function<bool_(const_char_*,_unsigned_long)>::function
                (&local_c0,(function<bool_(const_char_*,_unsigned_long)> *)local_60);
      local_99 = read_content_chunked(strm,&local_c0);
      std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_c0);
    }
    else {
      bVar1 = has_header(&x->headers,"Content-Length");
      if (bVar1) {
        len_00 = get_header_value_uint64(&x->headers,"Content-Length",0);
        local_e8 = len_00;
        if (payload_max_length < len_00) {
          local_9a = 1;
          skip_content_with_length(strm,len_00);
          local_99 = 0;
        }
        else if (len_00 != 0) {
          std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_108,progress);
          std::function<bool_(const_char_*,_unsigned_long)>::function
                    (&local_128,(function<bool_(const_char_*,_unsigned_long)> *)local_60);
          local_99 = read_content_with_length(strm,len_00,&local_108,&local_128);
          std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_128);
          std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_108);
        }
      }
      else {
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  ((function<bool_(const_char_*,_unsigned_long)> *)&len,
                   (function<bool_(const_char_*,_unsigned_long)> *)local_60);
        local_99 = read_content_without_length(strm,(ContentReceiver *)&len);
        std::function<bool_(const_char_*,_unsigned_long)>::~function
                  ((function<bool_(const_char_*,_unsigned_long)> *)&len);
      }
    }
    if ((local_99 & 1) == 0) {
      iVar2 = 400;
      if ((local_9a & 1) != 0) {
        iVar2 = 0x19d;
      }
      *status = iVar2;
    }
    strm_local._7_1_ = (bool)(local_99 & 1);
  }
  local_98 = 1;
  std::function<bool_(const_char_*,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long)> *)local_60);
  return strm_local._7_1_;
}

Assistant:

bool read_content(Stream &strm, T &x, size_t payload_max_length, int &status,
                  Progress progress, ContentReceiver receiver) {

  ContentReceiver out = [&](const char *buf, size_t n) {
    return receiver(buf, n);
  };

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  detail::decompressor decompressor;

  if (!decompressor.is_valid()) {
    status = 500;
    return false;
  }

  if (x.get_header_value("Content-Encoding") == "gzip") {
    out = [&](const char *buf, size_t n) {
      return decompressor.decompress(
          buf, n, [&](const char *buf, size_t n) { return receiver(buf, n); });
    };
  }
#else
  if (x.get_header_value("Content-Encoding") == "gzip") {
    status = 415;
    return false;
  }
#endif

  auto ret = true;
  auto exceed_payload_max_length = false;

  if (is_chunked_transfer_encoding(x.headers)) {
    ret = read_content_chunked(strm, out);
  } else if (!has_header(x.headers, "Content-Length")) {
    ret = read_content_without_length(strm, out);
  } else {
    auto len = get_header_value_uint64(x.headers, "Content-Length", 0);
    if (len > payload_max_length) {
      exceed_payload_max_length = true;
      skip_content_with_length(strm, len);
      ret = false;
    } else if (len > 0) {
      ret = read_content_with_length(strm, len, progress, out);
    }
  }

  if (!ret) { status = exceed_payload_max_length ? 413 : 400; }

  return ret;
}